

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramUniformTests.cpp
# Opt level: O3

void __thiscall
deqp::gles31::Functional::UniformCase::generateBasicUniforms
          (UniformCase *this,
          vector<deqp::gles31::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles31::Functional::UniformCase::BasicUniform>_>
          *basicUniformsDst,
          vector<deqp::gles31::Functional::UniformCase::BasicUniformReportRef,_std::allocator<deqp::gles31::Functional::UniformCase::BasicUniformReportRef>_>
          *basicUniformReportsDst,VarType *varType,char *varName,bool isParentActive,
          int *samplerUnitCounter,Random *rnd)

{
  undefined8 *puVar1;
  undefined1 *puVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  DataType DVar4;
  StructType *pSVar5;
  VarType *varType_00;
  uint uVar6;
  long *plVar7;
  ulong uVar8;
  undefined8 *puVar9;
  int iVar10;
  int samplerUnit;
  size_type *psVar11;
  long *plVar12;
  ulong *puVar13;
  int elemNdx_;
  long lVar14;
  undefined8 uVar15;
  _Alloc_hider _Var16;
  pointer pSVar17;
  long lVar18;
  bool bVar19;
  vector<bool,_std::allocator<bool>_> local_300;
  string arrayRootName;
  VarValue value;
  ulong *local_250;
  long local_248;
  ulong local_240;
  long lStack_238;
  int local_22c;
  string indexedName;
  ulong *local_208;
  long local_200;
  ulong local_1f8 [2];
  long *local_1e8;
  long local_1e0;
  long local_1d8;
  long lStack_1d0;
  long *local_1c8 [2];
  long local_1b8 [2];
  string memberFullName;
  _Alloc_hider local_138;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_128 [15];
  
  if (varType->m_type == TYPE_ARRAY) {
    iVar10 = (varType->m_data).array.size;
    puVar2 = (undefined1 *)((long)&value.val + 0xc);
    value._0_8_ = puVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&value,0x1aee929);
    plVar7 = (long *)std::__cxx11::string::append((char *)&value);
    paVar3 = &memberFullName.field_2;
    psVar11 = (size_type *)(plVar7 + 2);
    if ((size_type *)*plVar7 == psVar11) {
      memberFullName.field_2._M_allocated_capacity = *psVar11;
      memberFullName.field_2._8_8_ = plVar7[3];
      memberFullName._M_dataplus._M_p = (pointer)paVar3;
    }
    else {
      memberFullName.field_2._M_allocated_capacity = *psVar11;
      memberFullName._M_dataplus._M_p = (pointer)*plVar7;
    }
    memberFullName._M_string_length = plVar7[1];
    *plVar7 = (long)psVar11;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    plVar7 = (long *)std::__cxx11::string::append((char *)&memberFullName);
    arrayRootName._M_dataplus._M_p = (pointer)&arrayRootName.field_2;
    psVar11 = (size_type *)(plVar7 + 2);
    if ((size_type *)*plVar7 == psVar11) {
      arrayRootName.field_2._M_allocated_capacity = *psVar11;
      arrayRootName.field_2._8_8_ = plVar7[3];
    }
    else {
      arrayRootName.field_2._M_allocated_capacity = *psVar11;
      arrayRootName._M_dataplus._M_p = (pointer)*plVar7;
    }
    arrayRootName._M_string_length = plVar7[1];
    *plVar7 = (long)psVar11;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)memberFullName._M_dataplus._M_p != paVar3) {
      operator_delete(memberFullName._M_dataplus._M_p,
                      memberFullName.field_2._M_allocated_capacity + 1);
    }
    if ((undefined1 *)value._0_8_ != puVar2) {
      operator_delete((void *)value._0_8_,value.val._12_8_ + 1);
    }
    elemNdx_ = 0;
    local_300.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_300.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._8_8_ =
         (ulong)(uint)local_300.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._12_4_ << 0x20;
    local_300.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_300.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._8_8_ =
         (ulong)(uint)local_300.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_finish.super__Bit_iterator_base._12_4_ << 0x20;
    local_300.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_end_of_storage = (_Bit_pointer)0x0;
    uVar6 = (varType->m_data).array.size;
    if (0 < (int)uVar6) {
      local_22c = iVar10 / 2;
      do {
        local_1c8[0] = local_1b8;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,0x1aee929);
        plVar7 = (long *)std::__cxx11::string::append((char *)local_1c8);
        local_1e8 = &local_1d8;
        plVar12 = plVar7 + 2;
        if ((long *)*plVar7 == plVar12) {
          local_1d8 = *plVar12;
          lStack_1d0 = plVar7[3];
        }
        else {
          local_1d8 = *plVar12;
          local_1e8 = (long *)*plVar7;
        }
        local_1e0 = plVar7[1];
        *plVar7 = (long)plVar12;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_1e8);
        local_250 = &local_240;
        puVar13 = (ulong *)(plVar7 + 2);
        if ((ulong *)*plVar7 == puVar13) {
          local_240 = *puVar13;
          lStack_238 = plVar7[3];
        }
        else {
          local_240 = *puVar13;
          local_250 = (ulong *)*plVar7;
        }
        local_248 = plVar7[1];
        *plVar7 = (long)puVar13;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&memberFullName);
        std::ostream::operator<<(&memberFullName,elemNdx_);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&memberFullName);
        std::ios_base::~ios_base((ios_base *)&local_138);
        uVar8 = 0xf;
        if (local_250 != &local_240) {
          uVar8 = local_240;
        }
        if (uVar8 < (ulong)(local_200 + local_248)) {
          uVar8 = 0xf;
          if (local_208 != local_1f8) {
            uVar8 = local_1f8[0];
          }
          if (uVar8 < (ulong)(local_200 + local_248)) goto LAB_01540609;
          puVar9 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_208,0,(char *)0x0,(ulong)local_250);
        }
        else {
LAB_01540609:
          puVar9 = (undefined8 *)
                   std::__cxx11::string::_M_append((char *)&local_250,(ulong)local_208);
        }
        value._0_8_ = (long)&value.val + 0xc;
        puVar1 = puVar9 + 2;
        if ((undefined8 *)*puVar9 == puVar1) {
          value.val._12_8_ = *puVar1;
          value.val._20_8_ = puVar9[3];
        }
        else {
          value.val._12_8_ = *puVar1;
          value._0_8_ = (undefined8 *)*puVar9;
        }
        value.val._4_8_ = puVar9[1];
        *puVar9 = puVar1;
        puVar9[1] = 0;
        *(undefined1 *)puVar1 = 0;
        plVar7 = (long *)std::__cxx11::string::append((char *)&value);
        indexedName._M_dataplus._M_p = (pointer)&indexedName.field_2;
        psVar11 = (size_type *)(plVar7 + 2);
        if ((size_type *)*plVar7 == psVar11) {
          indexedName.field_2._M_allocated_capacity = *psVar11;
          indexedName.field_2._8_8_ = plVar7[3];
        }
        else {
          indexedName.field_2._M_allocated_capacity = *psVar11;
          indexedName._M_dataplus._M_p = (pointer)*plVar7;
        }
        indexedName._M_string_length = plVar7[1];
        *plVar7 = (long)psVar11;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        if ((undefined1 *)value._0_8_ != (undefined1 *)((long)&value.val + 0xc)) {
          operator_delete((void *)value._0_8_,value.val._12_8_ + 1);
        }
        if (local_208 != local_1f8) {
          operator_delete(local_208,local_1f8[0] + 1);
        }
        if (local_250 != &local_240) {
          operator_delete(local_250,local_240 + 1);
        }
        if (local_1e8 != &local_1d8) {
          operator_delete(local_1e8,local_1d8 + 1);
        }
        if (local_1c8[0] != local_1b8) {
          operator_delete(local_1c8[0],local_1b8[0] + 1);
        }
        if ((isParentActive) &&
           ((uVar6 = *(uint *)&(this->super_CallLogWrapper).field_0x14, (uVar6 & 0x20) == 0 ||
            (((uint)(*(int *)&(basicUniformsDst->
                              super__Vector_base<deqp::gles31::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles31::Functional::UniformCase::BasicUniform>_>
                              )._M_impl.super__Vector_impl_data._M_finish -
                    *(int *)&(basicUniformsDst->
                             super__Vector_base<deqp::gles31::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles31::Functional::UniformCase::BasicUniform>_>
                             )._M_impl.super__Vector_impl_data._M_start) >> 3 & 1) == 0)))) {
          bVar19 = local_22c == elemNdx_ || (uVar6 & 1) == 0;
        }
        else {
          bVar19 = false;
        }
        std::vector<bool,_std::allocator<bool>_>::push_back(&local_300,bVar19);
        varType_00 = (varType->m_data).array.elementType;
        if (varType_00->m_type == TYPE_BASIC) {
          DVar4 = (varType_00->m_data).basic.type;
          samplerUnit = -1;
          if (DVar4 - TYPE_SAMPLER_1D < 0x1e) {
            samplerUnit = *samplerUnitCounter;
            *samplerUnitCounter = samplerUnit + 1;
          }
          generateRandomVarValue(&value,DVar4,rnd,samplerUnit);
          BasicUniform::BasicUniform
                    ((BasicUniform *)&memberFullName,indexedName._M_dataplus._M_p,DVar4,bVar19,
                     &value,arrayRootName._M_dataplus._M_p,elemNdx_,iVar10);
          std::
          vector<deqp::gles31::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles31::Functional::UniformCase::BasicUniform>_>
          ::emplace_back<deqp::gles31::Functional::UniformCase::BasicUniform>
                    (basicUniformsDst,(BasicUniform *)&memberFullName);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_138._M_p != local_128) {
            operator_delete(local_138._M_p,local_128[0]._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)memberFullName._M_dataplus._M_p != paVar3) {
            operator_delete(memberFullName._M_dataplus._M_p,
                            memberFullName.field_2._M_allocated_capacity + 1);
          }
        }
        else {
          generateBasicUniforms
                    (this,basicUniformsDst,basicUniformReportsDst,varType_00,
                     indexedName._M_dataplus._M_p,bVar19,samplerUnitCounter,rnd);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)indexedName._M_dataplus._M_p != &indexedName.field_2) {
          operator_delete(indexedName._M_dataplus._M_p,indexedName.field_2._M_allocated_capacity + 1
                         );
        }
        elemNdx_ = elemNdx_ + 1;
        uVar6 = (varType->m_data).array.size;
      } while (elemNdx_ < (int)uVar6);
    }
    uVar8 = (ulong)uVar6;
    if (((varType->m_data).array.elementType)->m_type == TYPE_BASIC) {
      do {
        if ((int)uVar8 < 1) break;
        uVar6 = (int)uVar8 - 1;
        uVar8 = (ulong)uVar6;
      } while (((ulong)(&((_Bit_iterator_base *)
                         local_300.super__Bvector_base<std::allocator<bool>_>._M_impl.
                         super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p)->_M_p)
                       [uVar6 >> 6] >> (uVar8 & 0x3f) & 1) == 0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&memberFullName,arrayRootName._M_dataplus._M_p,(allocator<char> *)&value)
      ;
      std::
      vector<deqp::gles31::Functional::UniformCase::BasicUniformReportRef,_std::allocator<deqp::gles31::Functional::UniformCase::BasicUniformReportRef>_>
      ::emplace_back<deqp::gles31::Functional::UniformCase::BasicUniformReportRef>
                (basicUniformReportsDst,(BasicUniformReportRef *)&memberFullName);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)memberFullName._M_dataplus._M_p != paVar3) {
        operator_delete(memberFullName._M_dataplus._M_p,
                        memberFullName.field_2._M_allocated_capacity + 1);
      }
    }
    if ((_Bit_iterator *)
        local_300.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p != (_Bit_iterator *)0x0) {
      operator_delete(local_300.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                      (long)local_300.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_end_of_storage -
                      (long)local_300.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
      local_300.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
      .super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    }
    uVar15 = arrayRootName.field_2._M_allocated_capacity;
    _Var16._M_p = arrayRootName._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)arrayRootName._M_dataplus._M_p == &arrayRootName.field_2) {
      return;
    }
  }
  else {
    if (varType->m_type != TYPE_BASIC) {
      pSVar5 = (varType->m_data).structPtr;
      pSVar17 = (pSVar5->m_members).
                super__Vector_base<glu::StructMember,_std::allocator<glu::StructMember>_>._M_impl.
                super__Vector_impl_data._M_start;
      if ((int)((ulong)((long)(pSVar5->m_members).
                              super__Vector_base<glu::StructMember,_std::allocator<glu::StructMember>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar17) >> 3) *
          -0x49249249 < 1) {
        return;
      }
      lVar18 = 0x20;
      lVar14 = 0;
      do {
        arrayRootName._M_dataplus._M_p = (pointer)&arrayRootName.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&arrayRootName,0x1aee929);
        plVar7 = (long *)std::__cxx11::string::append((char *)&arrayRootName);
        local_300.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p =
             (_Bit_type *)
             &local_300.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_finish;
        plVar12 = plVar7 + 2;
        if ((_Bit_iterator *)*plVar7 == (_Bit_iterator *)plVar12) {
          local_300.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)*plVar12;
          local_300.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_finish.super__Bit_iterator_base._8_8_ = plVar7[3];
        }
        else {
          local_300.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)*plVar12;
          local_300.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)*plVar7;
        }
        local_300.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._8_8_ = plVar7[1];
        *plVar7 = (long)plVar12;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_300);
        value._0_8_ = (long)&value.val + 0xc;
        plVar12 = plVar7 + 2;
        if ((long *)*plVar7 == plVar12) {
          value.val._12_8_ = *plVar12;
          value.val._20_8_ = plVar7[3];
        }
        else {
          value.val._12_8_ = *plVar12;
          value._0_8_ = (long *)*plVar7;
        }
        value.val._4_8_ = plVar7[1];
        *plVar7 = (long)plVar12;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        plVar7 = (long *)std::__cxx11::string::append((char *)&value);
        memberFullName._M_dataplus._M_p = (pointer)&memberFullName.field_2;
        psVar11 = (size_type *)(plVar7 + 2);
        if ((size_type *)*plVar7 == psVar11) {
          memberFullName.field_2._M_allocated_capacity = *psVar11;
          memberFullName.field_2._8_8_ = plVar7[3];
        }
        else {
          memberFullName.field_2._M_allocated_capacity = *psVar11;
          memberFullName._M_dataplus._M_p = (pointer)*plVar7;
        }
        memberFullName._M_string_length = plVar7[1];
        *plVar7 = (long)psVar11;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        if ((undefined1 *)value._0_8_ != (undefined1 *)((long)&value.val + 0xc)) {
          operator_delete((void *)value._0_8_,value.val._12_8_ + 1);
        }
        if ((_Bit_iterator *)
            local_300.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_start.super__Bit_iterator_base._M_p !=
            &local_300.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_finish) {
          operator_delete(local_300.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                          (long)local_300.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p + 1
                         );
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)arrayRootName._M_dataplus._M_p != &arrayRootName.field_2) {
          operator_delete(arrayRootName._M_dataplus._M_p,
                          arrayRootName.field_2._M_allocated_capacity + 1);
        }
        generateBasicUniforms
                  (this,basicUniformsDst,basicUniformReportsDst,
                   (VarType *)((long)&(pSVar17->m_name)._M_dataplus._M_p + lVar18),
                   memberFullName._M_dataplus._M_p,isParentActive,samplerUnitCounter,rnd);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)memberFullName._M_dataplus._M_p != &memberFullName.field_2) {
          operator_delete(memberFullName._M_dataplus._M_p,
                          memberFullName.field_2._M_allocated_capacity + 1);
        }
        lVar14 = lVar14 + 1;
        pSVar17 = (pSVar5->m_members).
                  super__Vector_base<glu::StructMember,_std::allocator<glu::StructMember>_>._M_impl.
                  super__Vector_impl_data._M_start;
        lVar18 = lVar18 + 0x38;
      } while (lVar14 < (int)((ulong)((long)(pSVar5->m_members).
                                            super__Vector_base<glu::StructMember,_std::allocator<glu::StructMember>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)pSVar17) >> 3) * -0x49249249);
      return;
    }
    if (isParentActive) {
      bVar19 = true;
      if (((this->super_CallLogWrapper).field_0x14 & 0x20) != 0) {
        bVar19 = ((uint)(*(int *)&(basicUniformsDst->
                                  super__Vector_base<deqp::gles31::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles31::Functional::UniformCase::BasicUniform>_>
                                  )._M_impl.super__Vector_impl_data._M_finish -
                        *(int *)&(basicUniformsDst->
                                 super__Vector_base<deqp::gles31::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles31::Functional::UniformCase::BasicUniform>_>
                                 )._M_impl.super__Vector_impl_data._M_start) >> 3 & 1) == 0;
      }
    }
    else {
      bVar19 = false;
    }
    DVar4 = (varType->m_data).basic.type;
    iVar10 = -1;
    if (DVar4 - TYPE_SAMPLER_1D < 0x1e) {
      iVar10 = *samplerUnitCounter;
      *samplerUnitCounter = iVar10 + 1;
    }
    generateRandomVarValue(&value,DVar4,rnd,iVar10);
    BasicUniform::BasicUniform
              ((BasicUniform *)&memberFullName,varName,(varType->m_data).basic.type,bVar19,&value,
               (char *)0x0,-1,1);
    std::
    vector<deqp::gles31::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles31::Functional::UniformCase::BasicUniform>_>
    ::emplace_back<deqp::gles31::Functional::UniformCase::BasicUniform>
              (basicUniformsDst,(BasicUniform *)&memberFullName);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_p != local_128) {
      operator_delete(local_138._M_p,local_128[0]._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)memberFullName._M_dataplus._M_p != &memberFullName.field_2) {
      operator_delete(memberFullName._M_dataplus._M_p,
                      memberFullName.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&memberFullName,varName,(allocator<char> *)&local_300);
    std::
    vector<deqp::gles31::Functional::UniformCase::BasicUniformReportRef,_std::allocator<deqp::gles31::Functional::UniformCase::BasicUniformReportRef>_>
    ::emplace_back<deqp::gles31::Functional::UniformCase::BasicUniformReportRef>
              (basicUniformReportsDst,(BasicUniformReportRef *)&memberFullName);
    uVar15 = memberFullName.field_2._M_allocated_capacity;
    _Var16 = memberFullName._M_dataplus;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)memberFullName._M_dataplus._M_p == &memberFullName.field_2) {
      return;
    }
  }
  operator_delete(_Var16._M_p,uVar15 + 1);
  return;
}

Assistant:

void UniformCase::generateBasicUniforms (vector<BasicUniform>& basicUniformsDst, vector<BasicUniformReportRef>& basicUniformReportsDst, const glu::VarType& varType, const char* const varName, const bool isParentActive, int& samplerUnitCounter, Random& rnd) const
{
	if (varType.isBasicType())
	{
		const bool				isActive	= isParentActive && (m_features & FEATURE_UNIFORMUSAGE_EVERY_OTHER ? basicUniformsDst.size() % 2 == 0 : true);
		const glu::DataType		type		= varType.getBasicType();
		const VarValue			value		= glu::isDataTypeSampler(type) ? generateRandomVarValue(type, rnd, samplerUnitCounter++)
																		   : generateRandomVarValue(varType.getBasicType(), rnd);

		basicUniformsDst.push_back(BasicUniform(varName, varType.getBasicType(), isActive, value));
		basicUniformReportsDst.push_back(BasicUniformReportRef(varName, varType.getBasicType(), isActive));
	}
	else if (varType.isArrayType())
	{
		const int		size			= varType.getArraySize();
		const string	arrayRootName	= string("") + varName + "[0]";
		vector<bool>	isElemActive;

		for (int elemNdx = 0; elemNdx < varType.getArraySize(); elemNdx++)
		{
			const string	indexedName		= string("") + varName + "[" + de::toString(elemNdx) + "]";
			const bool		isCurElemActive	= isParentActive																						&&
											  (m_features & FEATURE_UNIFORMUSAGE_EVERY_OTHER			? basicUniformsDst.size() % 2 == 0	: true)	&&
											  (m_features & FEATURE_ARRAYUSAGE_ONLY_MIDDLE_INDEX		? elemNdx == size/2					: true);

			isElemActive.push_back(isCurElemActive);

			if (varType.getElementType().isBasicType())
			{
				// \note We don't want separate entries in basicUniformReportsDst for elements of basic-type arrays.
				const glu::DataType	elemBasicType	= varType.getElementType().getBasicType();
				const VarValue		value			= glu::isDataTypeSampler(elemBasicType) ? generateRandomVarValue(elemBasicType, rnd, samplerUnitCounter++)
																							: generateRandomVarValue(elemBasicType, rnd);

				basicUniformsDst.push_back(BasicUniform(indexedName.c_str(), elemBasicType, isCurElemActive, value, arrayRootName.c_str(), elemNdx, size));
			}
			else
				generateBasicUniforms(basicUniformsDst, basicUniformReportsDst, varType.getElementType(), indexedName.c_str(), isCurElemActive, samplerUnitCounter, rnd);
		}

		if (varType.getElementType().isBasicType())
		{
			int minSize;
			for (minSize = varType.getArraySize(); minSize > 0 && !isElemActive[minSize-1]; minSize--);

			basicUniformReportsDst.push_back(BasicUniformReportRef(arrayRootName.c_str(), minSize, size, varType.getElementType().getBasicType(), isParentActive && minSize > 0));
		}
	}
	else
	{
		DE_ASSERT(varType.isStructType());

		const StructType& structType = *varType.getStructPtr();

		for (int i = 0; i < structType.getNumMembers(); i++)
		{
			const glu::StructMember&	member			= structType.getMember(i);
			const string				memberFullName	= string("") + varName + "." + member.getName();

			generateBasicUniforms(basicUniformsDst, basicUniformReportsDst, member.getType(), memberFullName.c_str(), isParentActive, samplerUnitCounter, rnd);
		}
	}
}